

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir_builder.h
# Opt level: O2

Instruction * __thiscall
spvtools::opt::InstructionBuilder::AddIAdd
          (InstructionBuilder *this,uint32_t type,uint32_t op1,uint32_t op2)

{
  IRContext *this_00;
  uint32_t res_id;
  Instruction *pIVar1;
  long lVar2;
  initializer_list<unsigned_int> init_list;
  initializer_list<unsigned_int> init_list_00;
  _Head_base<0UL,_spvtools::opt::Instruction_*,_false> local_108;
  uint32_t local_100;
  uint32_t local_fc;
  undefined1 local_f8 [48];
  undefined4 local_c8;
  SmallVector<unsigned_int,_2UL> local_c0;
  SmallVector<unsigned_int,_2UL> local_98;
  SmallVector<unsigned_int,_2UL> local_70;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  
  pIVar1 = (Instruction *)::operator_new(0x70);
  this_00 = this->context_;
  res_id = IRContext::TakeNextId(this_00);
  init_list._M_len = 1;
  init_list._M_array = &local_fc;
  local_fc = op1;
  utils::SmallVector<unsigned_int,_2UL>::SmallVector(&local_70,init_list);
  local_f8._0_4_ = 1;
  utils::SmallVector<unsigned_int,_2UL>::SmallVector
            ((SmallVector<unsigned_int,_2UL> *)(local_f8 + 8),&local_70);
  init_list_00._M_len = 1;
  init_list_00._M_array = &local_100;
  local_100 = op2;
  utils::SmallVector<unsigned_int,_2UL>::SmallVector(&local_98,init_list_00);
  local_c8 = 1;
  utils::SmallVector<unsigned_int,_2UL>::SmallVector(&local_c0,&local_98);
  local_48 = 0;
  uStack_40 = 0;
  local_38 = 0;
  std::vector<spvtools::opt::Operand,std::allocator<spvtools::opt::Operand>>::
  _M_range_initialize<spvtools::opt::Operand_const*>
            ((vector<spvtools::opt::Operand,std::allocator<spvtools::opt::Operand>> *)&local_48,
             local_f8,&local_98);
  Instruction::Instruction(pIVar1,this_00,OpIAdd,type,res_id,(OperandList *)&local_48);
  local_108._M_head_impl = pIVar1;
  std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::~vector
            ((vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_> *)&local_48);
  lVar2 = 0x38;
  do {
    utils::SmallVector<unsigned_int,_2UL>::~SmallVector
              ((SmallVector<unsigned_int,_2UL> *)(local_f8 + lVar2));
    lVar2 = lVar2 + -0x30;
  } while (lVar2 != -0x28);
  utils::SmallVector<unsigned_int,_2UL>::~SmallVector(&local_98);
  utils::SmallVector<unsigned_int,_2UL>::~SmallVector(&local_70);
  pIVar1 = AddInstruction(this,(unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
                                *)&local_108);
  if (local_108._M_head_impl != (Instruction *)0x0) {
    (*((local_108._M_head_impl)->super_IntrusiveNodeBase<spvtools::opt::Instruction>).
      _vptr_IntrusiveNodeBase[1])();
  }
  return pIVar1;
}

Assistant:

Instruction* AddIAdd(uint32_t type, uint32_t op1, uint32_t op2) {
    // TODO(1841): Handle id overflow.
    std::unique_ptr<Instruction> inst(new Instruction(
        GetContext(), spv::Op::OpIAdd, type, GetContext()->TakeNextId(),
        {{SPV_OPERAND_TYPE_ID, {op1}}, {SPV_OPERAND_TYPE_ID, {op2}}}));
    return AddInstruction(std::move(inst));
  }